

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_adjointcheckpointscheme.c
# Opt level: O0

SUNErrCode
SUNAdjointCheckpointScheme_InsertVector
          (SUNAdjointCheckpointScheme_conflict self,suncountertype step_num,suncountertype stage_num
          ,sunrealtype t,N_Vector state)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_XMM0_Qa;
  SUNErrCode err;
  SUNContext sunctx_local_scope_;
  undefined4 local_4;
  
  if (*(long *)(*in_RDI + 8) == 0) {
    local_4 = -0x2701;
  }
  else {
    local_4 = (**(code **)(*in_RDI + 8))(in_XMM0_Qa,in_RDI,in_RSI,in_RDX,in_RCX);
  }
  return local_4;
}

Assistant:

SUNErrCode SUNAdjointCheckpointScheme_InsertVector(SUNAdjointCheckpointScheme self,
                                                   suncountertype step_num,
                                                   suncountertype stage_num,
                                                   sunrealtype t, N_Vector state)
{
  SUNFunctionBegin(self->sunctx);
  SUNDIALS_MARK_FUNCTION_BEGIN(SUNCTX_->profiler);
  if (self->ops->insertvector)
  {
    SUNErrCode err = self->ops->insertvector(self, step_num, stage_num, t, state);
    SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
    return err;
  }
  SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
  return SUN_ERR_NOT_IMPLEMENTED;
}